

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O3

void __thiscall
deqp::gls::ContextArray::data(ContextArray *this,Target target,int size,char *ptr,Usage usage)

{
  uint uVar1;
  deUint32 dVar2;
  char *__dest;
  
  this->m_size = size;
  this->m_target = target;
  if (this->m_storage == STORAGE_USER) {
    if (this->m_data != (char *)0x0) {
      operator_delete__(this->m_data);
    }
    __dest = (char *)operator_new__((long)size);
    this->m_data = __dest;
    memcpy(__dest,ptr,(long)size);
    return;
  }
  if (this->m_storage == STORAGE_BUFFER) {
    uVar1 = targetToGL::targets[(int)target];
    (*this->m_ctx->_vptr_Context[0x25])(this->m_ctx,(ulong)uVar1,(ulong)this->m_glBuffer);
    dVar2 = (*this->m_ctx->_vptr_Context[0x79])();
    glu::checkError(dVar2,"glBindBuffer()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsVertexArrayTests.cpp"
                    ,0x1f1);
    (*this->m_ctx->_vptr_Context[0x28])
              (this->m_ctx,(ulong)uVar1,(long)size,ptr,(ulong)usageToGL::usages[(int)usage]);
    dVar2 = (*this->m_ctx->_vptr_Context[0x79])();
    glu::checkError(dVar2,"glBufferData()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsVertexArrayTests.cpp"
                    ,500);
    return;
  }
  return;
}

Assistant:

void ContextArray::data (Target target, int size, const char* ptr, Usage usage)
{
	m_size = size;
	m_target = target;

	if (m_storage == STORAGE_BUFFER)
	{
		m_ctx.bindBuffer(targetToGL(target), m_glBuffer);
		GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glBindBuffer()");

		m_ctx.bufferData(targetToGL(target), size, ptr, usageToGL(usage));
		GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glBufferData()");
	}
	else if (m_storage == STORAGE_USER)
	{
		if (m_data)
			delete[] m_data;

		m_data = new char[size];
		std::memcpy(m_data, ptr, size);
	}
	else
		DE_ASSERT(false);
}